

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<8,_8192>::Mark(ObjectBlockPool<8,_8192> *this,uint number)

{
  MyLargeBlock *pMVar1;
  MyLargeBlock **ppMVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (number < 2) {
    ppMVar2 = &this->activePages;
    while (pMVar1 = *ppMVar2, pMVar1 != (MyLargeBlock *)0x0) {
      uVar3 = 0;
      while( true ) {
        uVar4 = (ulong)this->lastNum;
        if (pMVar1 != this->activePages) {
          uVar4 = 0x2000;
        }
        if (uVar4 <= uVar3) break;
        pMVar1->page[uVar3].marker = pMVar1->page[uVar3].marker & 0xfffffffffffffffe | (ulong)number
        ;
        uVar3 = uVar3 + 1;
      }
      ppMVar2 = &pMVar1->next;
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<8, 8192>::Mark(unsigned int) [elemSize = 8, countInBlock = 8192]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}